

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  byte *pbVar1;
  int32 iVar2;
  int iVar3;
  string *psVar4;
  GoogleOnceDynamic *this_00;
  long lVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  FieldOptions *pFVar10;
  FieldOptions *pFVar11;
  string *psVar12;
  FieldDescriptor *pFVar13;
  string local_48;
  
  psVar12 = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar4 = (proto->name_).ptr_;
  if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,psVar12);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  iVar2 = *(int32 *)(this + 0x38);
  uVar8 = (proto->_has_bits_).has_bits_[0];
  (proto->_has_bits_).has_bits_[0] = uVar8 | 0x40;
  proto->number_ = iVar2;
  if (this[0x20] == (FieldDescriptor)0x1) {
    psVar12 = *(string **)(this + 0x28);
    (proto->_has_bits_).has_bits_[0] = uVar8 | 0x50;
    psVar4 = (proto->json_name_).ptr_;
    if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena(&proto->json_name_,psVar12);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  iVar3 = *(int *)(this + 0x4c);
  bVar6 = FieldDescriptorProto_Label_IsValid(iVar3);
  if (!bVar6) {
    __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x1487,
                  "void google::protobuf::FieldDescriptorProto::set_label(::google::protobuf::FieldDescriptorProto_Label)"
                 );
  }
  pbVar1 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
  *pbVar1 = *pbVar1 | 1;
  proto->label_ = iVar3;
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  iVar3 = *(int *)(this + 0x48);
  bVar6 = FieldDescriptorProto_Type_IsValid(iVar3);
  if (!bVar6) {
    __assert_fail("::google::protobuf::FieldDescriptorProto_Type_IsValid(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x14a0,
                  "void google::protobuf::FieldDescriptorProto::set_type(::google::protobuf::FieldDescriptorProto_Type)"
                 );
  }
  uVar8 = (proto->_has_bits_).has_bits_[0];
  uVar7 = uVar8 | 0x200;
  (proto->_has_bits_).has_bits_[0] = uVar7;
  proto->type_ = iVar3;
  if (this[0x50] == (FieldDescriptor)0x1) {
    if (*(char *)(*(long *)(this + 0x58) + 0x29) == '\0') {
      (proto->_has_bits_).has_bits_[0] = uVar8 | 0x202;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
      internal::ArenaStringPtr::SetNoArena
                (&proto->extendee_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      uVar7 = (proto->_has_bits_).has_bits_[0];
    }
    (proto->_has_bits_).has_bits_[0] = uVar7 | 2;
    psVar12 = (proto->extendee_).ptr_;
    if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&proto->extendee_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar12 = (proto->extendee_).ptr_;
    }
    std::__cxx11::string::_M_append((char *)psVar12,**(ulong **)(*(long *)(this + 0x58) + 8));
  }
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  uVar8 = *(uint *)(this + 0x48);
  this_00 = *(GoogleOnceDynamic **)(this + 0x40);
  if ((uVar8 & 0xfffffffe) == 10) {
    if (this_00 != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>(this_00,TypeOnceInit,this);
    }
    lVar9 = *(long *)(this + 0x70);
    if (*(char *)(lVar9 + 0x28) == '\x01') {
      proto->type_ = 1;
      pbVar1 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 & 0xfd;
    }
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
      lVar9 = *(long *)(this + 0x70);
    }
    uVar8 = (proto->_has_bits_).has_bits_[0];
    if (*(char *)(lVar9 + 0x29) == '\0') {
      (proto->_has_bits_).has_bits_[0] = uVar8 | 4;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
      internal::ArenaStringPtr::SetNoArena
                (&proto->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      uVar8 = (proto->_has_bits_).has_bits_[0];
    }
    (proto->_has_bits_).has_bits_[0] = uVar8 | 4;
    psVar12 = (proto->type_name_).ptr_;
    if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&proto->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar12 = (proto->type_name_).ptr_;
    }
    pFVar13 = this + 0x70;
  }
  else {
    if (this_00 != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>(this_00,TypeOnceInit,this);
      uVar8 = *(uint *)(this + 0x48);
    }
    if (uVar8 != 0xe) goto LAB_002d7425;
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    uVar8 = (proto->_has_bits_).has_bits_[0];
    if (*(char *)(*(long *)(this + 0x78) + 0x29) == '\0') {
      (proto->_has_bits_).has_bits_[0] = uVar8 | 4;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
      internal::ArenaStringPtr::SetNoArena
                (&proto->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      uVar8 = (proto->_has_bits_).has_bits_[0];
    }
    (proto->_has_bits_).has_bits_[0] = uVar8 | 4;
    psVar12 = (proto->type_name_).ptr_;
    if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&proto->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar12 = (proto->type_name_).ptr_;
    }
    pFVar13 = this + 0x78;
  }
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  std::__cxx11::string::_M_append((char *)psVar12,**(ulong **)(*(long *)pFVar13 + 8));
LAB_002d7425:
  if (this[0x98] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&local_48,this,false);
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    internal::ArenaStringPtr::SetNoArena
              (&proto->default_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  lVar9 = *(long *)(this + 0x60);
  if ((lVar9 != 0) && (this[0x50] == (FieldDescriptor)0x0)) {
    lVar5 = *(long *)(*(long *)(lVar9 + 0x10) + 0x40);
    (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 0x80;
    proto->oneof_index_ = (int)((ulong)(lVar9 - lVar5) >> 4) * -0x55555555;
  }
  pFVar11 = *(FieldOptions **)(this + 0x80);
  pFVar10 = FieldOptions::default_instance();
  if (pFVar11 != pFVar10) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    pFVar11 = proto->options_;
    if (pFVar11 == (FieldOptions *)0x0) {
      pFVar11 = (FieldOptions *)operator_new(0x78);
      FieldOptions::FieldOptions(pFVar11);
      proto->options_ = pFVar11;
    }
    FieldOptions::CopyFrom(pFVar11,*(FieldOptions **)(this + 0x80));
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
                     implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
                    implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != NULL && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}